

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

void __thiscall
presolve::HPresolve::dualImpliedFreeGetRhsAndRowType
          (HPresolve *this,HighsInt row,double *rhs,RowType *rowType,bool relaxRowDualBounds)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (this->model->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[row];
  dVar2 = (this->model->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[row];
  if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
    *rowType = kEq;
    *rhs = dVar2;
    return;
  }
  if ((INFINITY <= dVar2) ||
     ((this->options->super_HighsOptionsStruct).dual_feasibility_tolerance <
      (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[row])) {
    *rowType = kGeq;
    *rhs = dVar1;
    if (relaxRowDualBounds) {
      changeRowDualLower(this,row,-INFINITY);
      return;
    }
  }
  else {
    *rowType = kLeq;
    *rhs = dVar2;
    if (relaxRowDualBounds) {
      changeRowDualUpper(this,row,INFINITY);
      return;
    }
  }
  return;
}

Assistant:

void HPresolve::dualImpliedFreeGetRhsAndRowType(
    HighsInt row, double& rhs, HighsPostsolveStack::RowType& rowType,
    bool relaxRowDualBounds) {
  assert(isDualImpliedFree(row));
  if (model->row_lower_[row] == model->row_upper_[row]) {
    rowType = HighsPostsolveStack::RowType::kEq;
    rhs = model->row_upper_[row];
  } else if (model->row_upper_[row] != kHighsInf &&
             implRowDualUpper[row] <= options->dual_feasibility_tolerance) {
    rowType = HighsPostsolveStack::RowType::kLeq;
    rhs = model->row_upper_[row];
    if (relaxRowDualBounds) changeRowDualUpper(row, kHighsInf);
  } else {
    rowType = HighsPostsolveStack::RowType::kGeq;
    rhs = model->row_lower_[row];
    if (relaxRowDualBounds) changeRowDualLower(row, -kHighsInf);
  }
}